

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_vepu2_v2.c
# Opt level: O1

MPP_RET hal_vp8e_vepu2_wait_v2(void *hal,HalEncTask *task)

{
  RK_U32 RVar1;
  uint uVar2;
  long lVar3;
  EncRcTask *pEVar4;
  MPP_RET MVar5;
  HalVp8eCtx *ctx;
  
  if (*(MppDev *)((long)hal + 0x50) == (MppDev)0x0) {
    _mpp_log_l(2,"hal_vp8e_vepu2_v2","invalid dev ctx\n","hal_vp8e_vepu2_wait_v2");
    MVar5 = MPP_NOK;
  }
  else {
    lVar3 = *(long *)((long)hal + 0x58);
    RVar1 = task->length;
    MVar5 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x50),0x10,(void *)0x0);
    if (MVar5 != MPP_OK) {
      _mpp_log_l(2,"hal_vp8e_vepu2_v2","poll cmd failed %d\n","hal_vp8e_vepu2_wait_v2",
                 (ulong)(uint)MVar5);
    }
    *(uint *)((long)hal + 8) = *(uint *)(lVar3 + 0x1b4) & 0x250;
    uVar2 = *(uint *)(lVar3 + 0x1b4);
    if ((uVar2 & 2) == 0) {
      if ((uVar2 & 0x20) != 0) {
        *(undefined4 *)((long)hal + 0x3830) = 0;
      }
    }
    else {
      lVar3 = *(long *)((long)hal + 0x58);
      *(uint *)((long)hal + 0x194) = *(uint *)(lVar3 + 0xd4) >> 3;
      *(uint *)((long)hal + 500) = *(uint *)(lVar3 + 0xe8) >> 10 & 0xfffffffe;
      *(uint *)((long)hal + 0x330) = (uint)*(ushort *)(lVar3 + 0x1a0);
      *(uint *)((long)hal + 0x1f0) = (*(uint *)(lVar3 + 0xf8) & 0x7fffff) * 3;
      *(undefined4 *)((long)hal + 0x310) = 0xffffffff;
      *(undefined4 *)((long)hal + 0x318) = 0xffffffff;
      *(undefined4 *)((long)hal + 0x31c) = 0xffffffff;
      *(undefined4 *)((long)hal + 800) = 0xffffffff;
      *(undefined4 *)((long)hal + 0x324) = 0xffffffff;
      *(undefined8 *)((long)hal + 0x328) = 0xffffffffffffffff;
      *(undefined8 *)((long)hal + 0x4f4) = 0;
      *(undefined4 *)((long)hal + 0x500) = 0;
    }
    hal_vp8e_update_buffers(hal,task);
    pEVar4 = task->rc_task;
    *(uint *)((long)hal + 0x6920) = *(uint *)&pEVar4->frm >> 4 & 1;
    *(long *)((long)hal + 0x6918) = *(long *)((long)hal + 0x6918) + 1;
    (pEVar4->info).bit_real = *(int *)((long)hal + 0x690c) << 3;
    task->hw_length = task->length - RVar1;
  }
  return MVar5;
}

Assistant:

static MPP_RET hal_vp8e_vepu2_wait_v2(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalVp8eCtx *ctx = (HalVp8eCtx *)hal;

    Vp8eFeedback *fb = &ctx->feedback;
    Vp8eVepu2Reg_t *regs = (Vp8eVepu2Reg_t *) ctx->regs;
    RK_S32 sw_length = task->length;

    if (NULL == ctx->dev) {
        mpp_err_f("invalid dev ctx\n");
        return MPP_NOK;
    }

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret)
        mpp_err_f("poll cmd failed %d\n", ret);

    fb->hw_status = regs->sw109.val & HW_STATUS_MASK;
    if (regs->sw109.val & HW_STATUS_FRAME_READY)
        vp8e_update_hw_cfg(ctx);
    else if (regs->sw109.val & HW_STATUS_BUFFER_FULL)
        ctx->bitbuf[1].size = 0;

    hal_vp8e_update_buffers(ctx, task);

    ctx->last_frm_intra = task->rc_task->frm.is_intra;
    ctx->frame_cnt++;

    task->rc_task->info.bit_real = ctx->frame_size << 3;
    task->hw_length = task->length - sw_length;
    return ret;
}